

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_remove_checked(void)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  uint32_t uVar2;
  
  r = roaring_bitmap_create();
  for (uVar2 = 0; uVar2 != 0x6bd19; uVar2 = uVar2 + 0xdcd) {
    roaring_bitmap_add(r,uVar2);
  }
  for (uVar2 = 0; uVar2 != 0x6bd19; uVar2 = uVar2 + 0xdcd) {
    _Var1 = roaring_bitmap_remove_checked(r,uVar2);
    _assert_true((ulong)_Var1,"roaring_bitmap_remove_checked(bm, i * 3533)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x646);
    _Var1 = roaring_bitmap_remove_checked(r,uVar2);
    _assert_true((ulong)!_Var1,"roaring_bitmap_remove_checked(bm, i * 3533)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x647);
  }
  _Var1 = roaring_bitmap_remove_checked(r,999);
  _assert_true((ulong)!_Var1,"roaring_bitmap_remove_checked(bm, 999)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x649);
  roaring_bitmap_add(r,999);
  _Var1 = roaring_bitmap_remove_checked(r,999);
  _assert_true((ulong)_Var1,"roaring_bitmap_remove_checked(bm, 999)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x64b);
  _Var1 = roaring_bitmap_is_empty(r);
  _assert_true((ulong)_Var1,"roaring_bitmap_is_empty(bm)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x64c);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_remove_checked) {
    roaring_bitmap_t *bm = roaring_bitmap_create();
    for (uint32_t i = 0; i < 125; ++i) {
        roaring_bitmap_add(bm, i * 3533);
    }
    for (uint32_t i = 0; i < 125; ++i) {
        assert_true(roaring_bitmap_remove_checked(bm, i * 3533));
        assert_false(roaring_bitmap_remove_checked(bm, i * 3533));
    }
    assert_false(roaring_bitmap_remove_checked(bm, 999));
    roaring_bitmap_add(bm, 999);
    assert_true(roaring_bitmap_remove_checked(bm, 999));
    assert_true(roaring_bitmap_is_empty(bm));
    roaring_bitmap_free(bm);
}